

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

void CheckedReturnWrap(CodeGenRegVmStateContext *vmState,uintptr_t frameBase,uint typeId)

{
  uint uVar1;
  CodeGenRegVmContext *pCVar2;
  uint *puVar3;
  char *__src;
  ExternTypeInfo *pEVar4;
  void *pvVar5;
  char *copy_1;
  uint objSize;
  char *copy;
  uint length;
  ExternTypeInfo *type;
  void *ptr;
  char *returnValuePtr;
  uintptr_t frameEnd;
  CodeGenRegVmContext *ctx;
  uint typeId_local;
  uintptr_t frameBase_local;
  CodeGenRegVmStateContext *vmState_local;
  
  pCVar2 = vmState->ctx;
  puVar3 = vmState->tempStackArrayBase;
  __src = *(char **)puVar3;
  if ((frameBase <= __src) && (__src <= vmState->dataStackEnd)) {
    NULLC::SetCollectMemory(false);
    pEVar4 = pCVar2->exTypes;
    if (pEVar4[typeId].field_8.arrSize == 0xffffffff) {
      uVar1 = puVar3[2];
      pvVar5 = NULLC::AllocObject(pCVar2->exTypes[pEVar4[typeId].field_11.subType].size * uVar1,
                                  pEVar4[typeId].field_11.subType);
      memcpy(pvVar5,__src,(ulong)(pCVar2->exTypes[pEVar4[typeId].field_11.subType].size * uVar1));
      *(void **)puVar3 = pvVar5;
    }
    else {
      uVar1 = pEVar4[typeId].size;
      pvVar5 = NULLC::AllocObject(uVar1,typeId);
      memcpy(pvVar5,__src,(ulong)uVar1);
      *(void **)puVar3 = pvVar5;
    }
    NULLC::SetCollectMemory(false);
  }
  return;
}

Assistant:

void CheckedReturnWrap(CodeGenRegVmStateContext *vmState, uintptr_t frameBase, unsigned typeId)
{
	CodeGenRegVmContext &ctx = *vmState->ctx;

	uintptr_t frameEnd = uintptr_t(vmState->dataStackEnd);

	char *returnValuePtr = (char*)vmState->tempStackArrayBase;

	void *ptr;
	memcpy(&ptr, returnValuePtr, sizeof(ptr));

	if(uintptr_t(ptr) >= frameBase && uintptr_t(ptr) <= frameEnd)
	{
		// Don't want to trigger GC at this point
		NULLC::SetCollectMemory(false);

		ExternTypeInfo &type = ctx.exTypes[typeId];

		if(type.arrSize == ~0u)
		{
			unsigned length = *(int*)(returnValuePtr + sizeof(void*));

			char *copy = (char*)NULLC::AllocObject(ctx.exTypes[type.subType].size * length, type.subType);
			memcpy(copy, ptr, unsigned(ctx.exTypes[type.subType].size * length));
			memcpy(returnValuePtr, &copy, sizeof(copy));
		}
		else
		{
			unsigned objSize = type.size;

			char *copy = (char*)NULLC::AllocObject(objSize, typeId);
			memcpy(copy, ptr, objSize);
			memcpy(returnValuePtr, &copy, sizeof(copy));
		}

		NULLC::SetCollectMemory(false);
	}
}